

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O3

_Bool ckh_new(tsd_t *tsd,ckh_t *ckh,size_t minitems,ckh_hash_t *hash,ckh_keycomp_t *keycomp)

{
  long *plVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  uintptr_t uVar4;
  void *pvVar5;
  arena_t *paVar6;
  long lVar7;
  undefined8 uVar8;
  ckhc_t *key;
  rtree_leaf_elm_t *prVar9;
  atomic_p_t arena;
  size_t sVar10;
  byte bVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  uintptr_t *puVar15;
  ulong uVar16;
  
  ckh->prng_state = 0x2a;
  ckh->count = 0;
  uVar13 = 0xffffffff;
  do {
    bVar11 = (char)uVar13 + 3;
    uVar13 = uVar13 + 1;
  } while ((ulong)(1L << (bVar11 & 0x3f)) < (minitems + (minitems % 3 ^ 3)) / 3 << 2);
  ckh->lg_minbuckets = uVar13;
  ckh->lg_curbuckets = uVar13;
  ckh->hash = hash;
  uVar14 = 0x10L << (bVar11 & 0x3f);
  ckh->keycomp = keycomp;
  if (uVar14 < 0x3801) {
    uVar13 = (int)uVar14 + 0x3fU & 0x7fc0;
    if (uVar13 < 0x1001) {
      sVar10 = sz_index2size_tab[sz_size2index_tab[uVar13 >> 3]];
    }
    else {
      uVar14 = (ulong)uVar13 * 2 - 1;
      lVar12 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      uVar14 = ~(-1L << ((char)lVar12 - 3U & 0x3f));
      if ((uint)lVar12 < 7) {
        uVar14 = 0xf;
      }
      sVar10 = ~uVar14 & uVar14 + uVar13;
    }
    uVar16 = 0x4000;
    if (0x3fff < sVar10) goto LAB_001102c1;
  }
  else {
    uVar16 = 0x4000;
    if (uVar14 < 0x4001) goto LAB_001102c1;
    if (uVar14 < 0x7000000000000001) {
      uVar16 = (0x20L << (bVar11 & 0x3f)) - 1;
      lVar12 = 0x3f;
      if (uVar16 != 0) {
        for (; uVar16 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      uVar16 = ~(-1L << ((char)lVar12 - 3U & 0x3f));
      if ((uint)lVar12 < 7) {
        uVar16 = 0xf;
      }
      sVar10 = ~uVar16 & uVar16 + uVar14;
    }
    else {
      sVar10 = 0;
    }
    if (0xffffffffffffefff < sVar10 || sVar10 < uVar14) {
      return true;
    }
  }
  uVar16 = sVar10;
  if (sVar10 + 0x8fffffffffffffff < 0x9000000000000000) {
    return true;
  }
LAB_001102c1:
  if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01') {
    arena.repr = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena;
    if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena == (arena_t *)0x0) &&
       (arena.repr = arena_choose_hard(tsd,true),
       tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true)) {
      paVar6 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).arena;
      if (paVar6 == (arena_t *)0x0) {
        tcache_arena_associate
                  ((tsdn_t *)tsd,&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,
                   (arena_t *)arena.repr);
      }
      else if (paVar6 != (arena_t *)arena.repr) {
        tcache_arena_reassociate
                  ((tsdn_t *)tsd,&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,
                   (arena_t *)arena.repr);
      }
    }
  }
  else {
    arena = arenas[0];
    if (arenas[0].repr == (void *)0x0) {
      arena.repr = arena_init((tsdn_t *)tsd,0,&extent_hooks_default);
    }
  }
  key = (ckhc_t *)arena_palloc((tsdn_t *)tsd,(arena_t *)arena.repr,uVar16,0x40,true,(tcache_t *)0x0)
  ;
  if (key != (ckhc_t *)0x0) {
    uVar14 = (ulong)key & 0xffffffffc0000000;
    uVar13 = ((uint)((ulong)key >> 0x1e) & 0xf) << 4;
    puVar15 = (uintptr_t *)
              ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache
                      [0].leafkey + (ulong)uVar13);
    uVar4 = *puVar15;
    if (uVar4 == uVar14) {
      prVar9 = (rtree_leaf_elm_t *)
               ((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) +
               *(long *)((long)&(tsd->
                                cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                                cache[0].leaf + (ulong)uVar13));
    }
    else if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
             leafkey == uVar14) {
      prVar9 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
               leaf;
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey =
           uVar4;
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leaf =
           *(rtree_leaf_elm_t **)
            ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache[0].
                    leaf + (ulong)uVar13);
      *puVar15 = uVar14;
      *(rtree_leaf_elm_t **)
       ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache[0].leaf
       + (ulong)uVar13) = prVar9;
      prVar9 = (rtree_leaf_elm_t *)
               ((long)&(prVar9->le_bits).repr + (ulong)((uint)((ulong)key >> 9) & 0x1ffff8));
    }
    else {
      lVar12 = 0x148;
      do {
        if (*(ulong *)((long)(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                             cache + lVar12 + -0x38) == uVar14) {
          lVar7 = *(long *)((long)((tsd->
                                   cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                                   cache + -3) + lVar12);
          puVar2 = (undefined8 *)
                   ((long)(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                          cache + lVar12 + -0x48);
          uVar8 = puVar2[1];
          puVar3 = (undefined8 *)
                   ((long)(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                          cache + lVar12 + -0x38);
          *puVar3 = *puVar2;
          puVar3[1] = uVar8;
          *(uintptr_t *)
           ((long)(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache +
           lVar12 + -0x48) = uVar4;
          *(undefined8 *)
           ((long)((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache + -4
                  ) + lVar12) =
               *(undefined8 *)
                ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache
                        [0].leaf + (ulong)uVar13);
          *puVar15 = uVar14;
          *(long *)((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                           cache[0].leaf + (ulong)uVar13) = lVar7;
          prVar9 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) + lVar7);
          goto LAB_00110343;
        }
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x1b8);
      prVar9 = rtree_leaf_elm_lookup_hard
                         ((tsdn_t *)tsd,&extents_rtree,
                          &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx,
                          (uintptr_t)key,true,false);
    }
LAB_00110343:
    pvVar5 = arenas[*(uint *)(((long)(prVar9->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe) &
                    0xfff].repr;
    uVar4 = *puVar15;
    if (uVar4 == uVar14) {
      prVar9 = (rtree_leaf_elm_t *)
               ((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) +
               *(long *)((long)&(tsd->
                                cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                                cache[0].leaf + (ulong)uVar13));
    }
    else if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
             leafkey == uVar14) {
      prVar9 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
               leaf;
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey =
           uVar4;
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leaf =
           *(rtree_leaf_elm_t **)
            ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache[0].
                    leaf + (ulong)uVar13);
      *puVar15 = uVar14;
      *(rtree_leaf_elm_t **)
       ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache[0].leaf
       + (ulong)uVar13) = prVar9;
      prVar9 = (rtree_leaf_elm_t *)
               ((long)&(prVar9->le_bits).repr + (ulong)((uint)((ulong)key >> 9) & 0x1ffff8));
    }
    else {
      lVar12 = 0x148;
      do {
        if (*(ulong *)((long)(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                             cache + lVar12 + -0x38) == uVar14) {
          lVar7 = *(long *)((long)((tsd->
                                   cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                                   cache + -3) + lVar12);
          puVar2 = (undefined8 *)
                   ((long)(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                          cache + lVar12 + -0x48);
          uVar8 = puVar2[1];
          puVar3 = (undefined8 *)
                   ((long)(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                          cache + lVar12 + -0x38);
          *puVar3 = *puVar2;
          puVar3[1] = uVar8;
          *(uintptr_t *)
           ((long)(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache +
           lVar12 + -0x48) = uVar4;
          *(undefined8 *)
           ((long)((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache + -4
                  ) + lVar12) =
               *(undefined8 *)
                ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache
                        [0].leaf + (ulong)uVar13);
          *puVar15 = uVar14;
          *(long *)((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                           cache[0].leaf + (ulong)uVar13) = lVar7;
          prVar9 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) + lVar7);
          goto LAB_00110380;
        }
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x1b8);
      prVar9 = rtree_leaf_elm_lookup_hard
                         ((tsdn_t *)tsd,&extents_rtree,
                          &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx,
                          (uintptr_t)key,true,false);
    }
LAB_00110380:
    LOCK();
    plVar1 = (long *)((long)pvVar5 + 0x68);
    *plVar1 = *plVar1 + sz_index2size_tab[(ulong)(prVar9->le_bits).repr >> 0x30];
    UNLOCK();
  }
  ckh->tab = key;
  return key == (ckhc_t *)0x0;
}

Assistant:

bool
ckh_new(tsd_t *tsd, ckh_t *ckh, size_t minitems, ckh_hash_t *hash,
    ckh_keycomp_t *keycomp) {
	bool ret;
	size_t mincells, usize;
	unsigned lg_mincells;

	assert(minitems > 0);
	assert(hash != NULL);
	assert(keycomp != NULL);

#ifdef CKH_COUNT
	ckh->ngrows = 0;
	ckh->nshrinks = 0;
	ckh->nshrinkfails = 0;
	ckh->ninserts = 0;
	ckh->nrelocs = 0;
#endif
	ckh->prng_state = 42; /* Value doesn't really matter. */
	ckh->count = 0;

	/*
	 * Find the minimum power of 2 that is large enough to fit minitems
	 * entries.  We are using (2+,2) cuckoo hashing, which has an expected
	 * maximum load factor of at least ~0.86, so 0.75 is a conservative load
	 * factor that will typically allow mincells items to fit without ever
	 * growing the table.
	 */
	assert(LG_CKH_BUCKET_CELLS > 0);
	mincells = ((minitems + (3 - (minitems % 3))) / 3) << 2;
	for (lg_mincells = LG_CKH_BUCKET_CELLS;
	    (ZU(1) << lg_mincells) < mincells;
	    lg_mincells++) {
		/* Do nothing. */
	}
	ckh->lg_minbuckets = lg_mincells - LG_CKH_BUCKET_CELLS;
	ckh->lg_curbuckets = lg_mincells - LG_CKH_BUCKET_CELLS;
	ckh->hash = hash;
	ckh->keycomp = keycomp;

	usize = sz_sa2u(sizeof(ckhc_t) << lg_mincells, CACHELINE);
	if (unlikely(usize == 0 || usize > SC_LARGE_MAXCLASS)) {
		ret = true;
		goto label_return;
	}
	ckh->tab = (ckhc_t *)ipallocztm(tsd_tsdn(tsd), usize, CACHELINE, true,
	    NULL, true, arena_ichoose(tsd, NULL));
	if (ckh->tab == NULL) {
		ret = true;
		goto label_return;
	}

	ret = false;
label_return:
	return ret;
}